

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O2

cmUVProcessChainBuilder * __thiscall
cmUVProcessChainBuilder::SetBuiltinStream(cmUVProcessChainBuilder *this,Stream stdio)

{
  if (stdio - Stream_OUTPUT < 2) {
    (this->Stdio)._M_elems[stdio].Type = Builtin;
  }
  return this;
}

Assistant:

cmUVProcessChainBuilder& cmUVProcessChainBuilder::SetBuiltinStream(
  Stream stdio)
{
  switch (stdio) {
    case Stream_INPUT:
      // FIXME
      break;

    case Stream_OUTPUT:
    case Stream_ERROR: {
      auto& streamData = this->Stdio[stdio];
      streamData.Type = Builtin;
      break;
    }
  }
  return *this;
}